

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

int __thiscall capnp::DynamicList::Builder::init(Builder *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  SegmentBuilder *pSVar2;
  CapTableBuilder *pCVar3;
  undefined8 uVar4;
  ElementSize elementSize;
  undefined2 uVar5;
  uint uVar6;
  Which elementType_00;
  ByteCount in_ECX;
  uint uVar7;
  uint in_EDX;
  ListBuilder *__return_storage_ptr__;
  Builder BVar8;
  Type TVar9;
  DebugComparison<unsigned_int_&,_unsigned_int> _kjCondition;
  ListSchema elementType;
  Fault f;
  undefined1 local_f4 [4];
  undefined1 local_f0 [32];
  uint local_d0;
  Type local_c0;
  PointerBuilder local_b0;
  Schema local_98;
  anon_union_8_2_eba6ea51_for_Type_5 local_90;
  SegmentBuilder *pSStack_88;
  CapTableBuilder *local_80;
  ListBuilder local_78;
  ListBuilder local_50;
  
  local_f0._0_8_ = local_f4;
  uVar6 = *(uint *)(ctx + 0x28);
  local_f0._8_4_ = uVar6;
  local_f0._16_8_ = " < ";
  local_f0._24_8_ = (WirePointer *)0x4;
  local_d0 = CONCAT31(local_d0._1_3_,in_EDX < uVar6);
  if (uVar6 <= in_EDX) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&,char_const(&)[26]>
              ((Fault *)&local_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x4e2,FAILED,"index < this->size()","_kjCondition,\"List index out-of-bounds.\"",
               (DebugComparison<unsigned_int_&,_unsigned_int> *)local_f0,
               (char (*) [26])"List index out-of-bounds.");
    kj::_::Debug::Fault::fatal((Fault *)&local_b0);
  }
  uVar5 = 0xe;
  if (ctx[2] == (EVP_PKEY_CTX)0x0) {
    uVar5 = *(undefined2 *)ctx;
  }
  switch(uVar5) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xf:
  case 0x10:
  case 0x11:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[25]>
              ((Fault *)local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x4f4,FAILED,(char *)0x0,"\"Expected a list or blob.\"",
               (char (*) [25])"Expected a list or blob.");
    kj::_::Debug::Fault::fatal((Fault *)local_f0);
  case 0xc:
    local_f0._16_8_ = ((ulong)*(uint *)(ctx + 0x2c) * (ulong)in_EDX >> 3) + *(long *)(ctx + 0x20);
    local_f0._0_8_ = *(undefined8 *)(ctx + 0x10);
    local_f0._8_8_ = *(undefined8 *)(ctx + 0x18);
    _::PointerBuilder::initBlob<capnp::Text>((Builder *)&local_90,(PointerBuilder *)local_f0,in_ECX)
    ;
    (this->builder).capTable = local_80;
    (this->schema).elementType.field_4 = local_90;
    (this->builder).segment = pSStack_88;
    (this->schema).elementType.baseType = UINT8;
    (this->schema).elementType.listDepth = '\0';
    (this->schema).elementType.isImplicitParam = false;
    break;
  case 0xd:
    local_f0._16_8_ = ((ulong)*(uint *)(ctx + 0x2c) * (ulong)in_EDX >> 3) + *(long *)(ctx + 0x20);
    local_f0._0_8_ = *(undefined8 *)(ctx + 0x10);
    local_f0._8_8_ = *(undefined8 *)(ctx + 0x18);
    BVar8 = _::PointerBuilder::initBlob<capnp::Data>((PointerBuilder *)local_f0,in_ECX);
    (this->schema).elementType.baseType = UINT16;
    (this->schema).elementType.listDepth = '\0';
    (this->schema).elementType.isImplicitParam = false;
    *(ArrayPtr<unsigned_char> *)&(this->schema).elementType.field_4 =
         BVar8.super_ArrayPtr<unsigned_char>;
    break;
  case 0xe:
    local_f4 = (undefined1  [4])in_EDX;
    TVar9 = (Type)Type::asList((Type *)ctx);
    local_c0.listDepth = TVar9.listDepth;
    local_c0 = TVar9;
    if ((local_c0.listDepth == '\0') && (TVar9.baseType == STRUCT)) {
      local_b0.segment = *(SegmentBuilder **)(ctx + 0x10);
      local_b0.capTable = *(CapTableBuilder **)(ctx + 0x18);
      local_b0.pointer =
           (WirePointer *)
           (((ulong)*(uint *)(ctx + 0x2c) * (ulong)(uint)local_f4 >> 3) + *(long *)(ctx + 0x20));
      local_98.raw = (RawBrandedSchema *)Type::asStruct(&local_c0);
      Schema::getProto((Reader *)local_f0,&local_98);
      uVar7 = 0;
      uVar6 = 0;
      if (0x7f < local_d0) {
        uVar6 = (uint)(((WirePointer *)(local_f0._16_8_ + 8))->field_1).structRef.ptrCount.value;
      }
      if (0xcf < local_d0) {
        uVar7 = (uint)(ushort)(((WirePointer *)(local_f0._16_8_ + 0x18))->offsetAndKind).value <<
                0x10;
      }
      __return_storage_ptr__ = &local_50;
      _::PointerBuilder::initStructList
                (__return_storage_ptr__,&local_b0,in_ECX,(StructSize)(uVar7 | uVar6));
    }
    else {
      local_f0._16_8_ =
           ((ulong)*(uint *)(ctx + 0x2c) * (ulong)(uint)local_f4 >> 3) + *(long *)(ctx + 0x20);
      local_f0._0_8_ = *(undefined8 *)(ctx + 0x10);
      local_f0._8_8_ = *(undefined8 *)(ctx + 0x18);
      elementType_00 = LIST;
      if (local_c0.listDepth == '\0') {
        elementType_00 = TVar9.baseType;
      }
      elementSize = anon_unknown_71::elementSizeFor(elementType_00);
      __return_storage_ptr__ = &local_78;
      _::PointerBuilder::initList
                (__return_storage_ptr__,(PointerBuilder *)local_f0,elementSize,in_ECX);
    }
    uVar1._0_4_ = __return_storage_ptr__->structDataSize;
    uVar1._4_2_ = __return_storage_ptr__->structPointerCount;
    uVar1._6_1_ = __return_storage_ptr__->elementSize;
    uVar1._7_1_ = __return_storage_ptr__->field_0x27;
    this[1].schema.elementType.baseType = (short)(undefined4)uVar1;
    this[1].schema.elementType.listDepth = (char)((ulong)uVar1 >> 0x10);
    this[1].schema.elementType.isImplicitParam = (bool)(char)((ulong)uVar1 >> 0x18);
    this[1].schema.elementType.field_3 =
         (anon_union_2_2_d12d5221_for_Type_3)(short)((ulong)uVar1 >> 0x20);
    *(short *)&this[1].schema.elementType.field_0x6 = (short)((ulong)uVar1 >> 0x30);
    pSVar2 = __return_storage_ptr__->segment;
    pCVar3 = __return_storage_ptr__->capTable;
    uVar4._0_4_ = __return_storage_ptr__->elementCount;
    uVar4._4_4_ = __return_storage_ptr__->step;
    *(byte **)&(this->builder).elementCount = __return_storage_ptr__->ptr;
    (this->builder).structDataSize = (undefined4)uVar4;
    (this->builder).structPointerCount = (short)((ulong)uVar4 >> 0x20);
    (this->builder).elementSize = (char)((ulong)uVar4 >> 0x30);
    (this->builder).field_0x27 = (char)((ulong)uVar4 >> 0x38);
    (this->builder).capTable = (CapTableBuilder *)pSVar2;
    (this->builder).ptr = (byte *)pCVar3;
    (this->schema).elementType.baseType = UINT32;
    (this->schema).elementType.listDepth = '\0';
    (this->schema).elementType.isImplicitParam = false;
    *(Type *)&(this->schema).elementType.field_4 = TVar9;
    break;
  case 0x12:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
              ((Fault *)local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x510,FAILED,(char *)0x0,"\"List(AnyPointer) not supported.\"",
               (char (*) [32])"List(AnyPointer) not supported.");
    kj::_::Debug::Fault::fatal((Fault *)local_f0);
  default:
    (this->schema).elementType.baseType = VOID;
    (this->schema).elementType.listDepth = '\0';
    (this->schema).elementType.isImplicitParam = false;
  }
  return (int)this;
}

Assistant:

DynamicValue::Builder DynamicList::Builder::init(uint index, uint size) {
  KJ_REQUIRE(index < this->size(), "List index out-of-bounds.");

  switch (schema.whichElementType()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::ENUM:
    case schema::Type::STRUCT:
    case schema::Type::INTERFACE:
      KJ_FAIL_REQUIRE("Expected a list or blob.");
      return nullptr;

    case schema::Type::TEXT:
      return builder.getPointerElement(bounded(index) * ELEMENTS)
                    .initBlob<Text>(bounded(size) * BYTES);

    case schema::Type::DATA:
      return builder.getPointerElement(bounded(index) * ELEMENTS)
                    .initBlob<Data>(bounded(size) * BYTES);

    case schema::Type::LIST: {
      auto elementType = schema.getListElementType();

      if (elementType.whichElementType() == schema::Type::STRUCT) {
        return DynamicList::Builder(elementType,
            builder.getPointerElement(bounded(index) * ELEMENTS)
                   .initStructList(bounded(size) * ELEMENTS,
                                   structSizeFromSchema(elementType.getStructElementType())));
      } else {
        return DynamicList::Builder(elementType,
            builder.getPointerElement(bounded(index) * ELEMENTS)
                   .initList(elementSizeFor(elementType.whichElementType()),
                             bounded(size) * ELEMENTS));
      }
    }

    case schema::Type::ANY_POINTER: {
      KJ_FAIL_ASSERT("List(AnyPointer) not supported.");
      return nullptr;
    }
  }

  return nullptr;
}